

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O0

void __thiscall icu_63::SortKeyByteSink::Append(SortKeyByteSink *this,char *bytes,int32_t n)

{
  uint uVar1;
  int iVar2;
  int32_t available;
  int32_t length;
  int32_t ignoreRest;
  int32_t n_local;
  char *bytes_local;
  SortKeyByteSink *this_local;
  
  if ((0 < n) && (bytes != (char *)0x0)) {
    length = n;
    _ignoreRest = bytes;
    if (0 < this->ignore_) {
      iVar2 = this->ignore_ - n;
      if (-1 < iVar2) {
        this->ignore_ = iVar2;
        return;
      }
      _ignoreRest = bytes + this->ignore_;
      length = -iVar2;
      this->ignore_ = 0;
    }
    uVar1 = this->appended_;
    this->appended_ = length + this->appended_;
    if (this->buffer_ + (int)uVar1 != _ignoreRest) {
      if ((int)(this->capacity_ - uVar1) < length) {
        (*(this->super_ByteSink)._vptr_ByteSink[5])
                  (this,_ignoreRest,(ulong)(uint)length,(ulong)uVar1);
      }
      else {
        memcpy(this->buffer_ + (int)uVar1,_ignoreRest,(long)length);
      }
    }
  }
  return;
}

Assistant:

void
SortKeyByteSink::Append(const char *bytes, int32_t n) {
    if (n <= 0 || bytes == NULL) {
        return;
    }
    if (ignore_ > 0) {
        int32_t ignoreRest = ignore_ - n;
        if (ignoreRest >= 0) {
            ignore_ = ignoreRest;
            return;
        } else {
            bytes += ignore_;
            n = -ignoreRest;
            ignore_ = 0;
        }
    }
    int32_t length = appended_;
    appended_ += n;
    if ((buffer_ + length) == bytes) {
        return;  // the caller used GetAppendBuffer() and wrote the bytes already
    }
    int32_t available = capacity_ - length;
    if (n <= available) {
        uprv_memcpy(buffer_ + length, bytes, n);
    } else {
        AppendBeyondCapacity(bytes, n, length);
    }
}